

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscPrintReceivedElements.cpp
# Opt level: O2

ostream * osc::operator<<(ostream *os,ReceivedMessage *m)

{
  bool bVar1;
  char *pcVar2;
  const_iterator i;
  ReceivedMessageArgument local_30;
  
  std::operator<<(os,"[");
  bVar1 = ReceivedMessage::AddressPatternIsUInt32(m);
  if (bVar1) {
    ReceivedMessage::AddressPatternAsUInt32(m);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  else {
    std::operator<<(os,m->addressPattern_);
  }
  local_30.typeTagPtr_ = m->typeTagsBegin_;
  local_30.argumentPtr_ = m->arguments_;
  pcVar2 = " ";
  while (local_30.typeTagPtr_ != m->typeTagsEnd_) {
    std::operator<<(os,pcVar2);
    operator<<(os,&local_30);
    ReceivedMessageArgumentIterator::operator++((ReceivedMessageArgumentIterator *)&local_30);
    pcVar2 = ", ";
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream & os, const ReceivedMessage& m )
{
    os << "[";
    if( m.AddressPatternIsUInt32() )
        os << m.AddressPatternAsUInt32();
    else
        os << m.AddressPattern();
    
    bool first = true;
    for( ReceivedMessage::const_iterator i = m.ArgumentsBegin();
            i != m.ArgumentsEnd(); ++i ){
        if( first ){
            os << " ";
            first = false;
        }else{
            os << ", ";
        }

        os << *i;
    }

    os << "]";

    return os;
}